

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O0

XMLNode * __thiscall ORPG::Core::XMLNode::insert_first_child(XMLNode *this,XMLNode *node)

{
  XMLNode *pXVar1;
  XMLNode *node_local;
  XMLNode *this_local;
  
  pXVar1 = first_child(this);
  pXVar1 = insert_before_node(this,pXVar1,node);
  return pXVar1;
}

Assistant:

XMLNode* XMLNode::insert_first_child(XMLNode* node) {
    return insert_before_node(first_child(), node);
}